

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_comisd_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int iVar1;
  float64 d1;
  float64 d0;
  int ret;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  iVar1 = float64_compare_x86_64(d->_d_ZMMReg[0],s->_d_ZMMReg[0],&env->sse_status);
  env->cc_src = (long)comis_eflags[iVar1 + 1];
  return;
}

Assistant:

void helper_comisd(CPUX86State *env, Reg *d, Reg *s)
{
    int ret;
    float64 d0, d1;

    d0 = d->ZMM_D(0);
    d1 = s->ZMM_D(0);
    ret = float64_compare(d0, d1, &env->sse_status);
    CC_SRC = comis_eflags[ret + 1];
}